

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  uint16_t uVar1;
  EVP_PKEY *pkey;
  int iVar2;
  int iVar3;
  _func_int_st_ptls_sign_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr_ptls_buffer_t_ptr_ptls_iovec_t_uint16_t_ptr_size_t
  *p_Var4;
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  int iVar5;
  uint8_t *puVar6;
  size_t sVar7;
  size_t sVar8;
  ptls_buffer_t *buf;
  size_t siglen;
  size_t local_48;
  EVP_PKEY_CTX *local_40;
  ptls_buffer_t *local_38;
  
  sVar7 = input.len;
  puVar6 = input.base;
  p_Var4 = _self[2].cb;
  uVar1 = *(uint16_t *)p_Var4;
  do {
    if (uVar1 == 0xffff) {
      return 0x28;
    }
    if (num_algorithms != 0) {
      sVar8 = 0;
      do {
        if (algorithms[sVar8] == uVar1) {
          *selected_algorithm = uVar1;
          pkey = (EVP_PKEY *)_self[1].cb;
          local_38 = outbuf;
          if (*(code **)(p_Var4 + 8) == (code *)0x0) {
            type = (EVP_MD *)0x0;
          }
          else {
            type = (EVP_MD *)(**(code **)(p_Var4 + 8))();
          }
          ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (ctx == (EVP_MD_CTX *)0x0) {
            return 0x201;
          }
          iVar2 = EVP_DigestSignInit(ctx,&local_40,type,(ENGINE *)0x0,pkey);
          iVar5 = 0x203;
          iVar3 = iVar5;
          if (iVar2 == 1) {
            iVar2 = EVP_PKEY_get_id(pkey);
            if (iVar2 == 0x43f) {
              iVar2 = EVP_DigestSign(ctx,0,&local_48,puVar6,sVar7);
              buf = local_38;
              if ((iVar2 != 1) || (iVar3 = ptls_buffer_reserve(local_38,local_48), iVar3 != 0))
              goto LAB_00105e14;
              iVar2 = EVP_DigestSign(ctx,buf->base + buf->off,&local_48,puVar6,sVar7);
            }
            else {
              iVar2 = EVP_PKEY_get_id(pkey);
              if (((iVar2 == 6) &&
                  (((iVar2 = EVP_PKEY_CTX_set_rsa_padding(local_40,6), iVar2 != 1 ||
                    (iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_40,0xffffffff), iVar2 != 1)) ||
                   (iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_40,type), iVar2 != 1)))) ||
                 (((iVar2 = EVP_DigestSignUpdate(ctx,puVar6,sVar7), buf = local_38, iVar2 != 1 ||
                   (iVar2 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_48), iVar2 != 1)) ||
                  (iVar3 = ptls_buffer_reserve(buf,local_48), iVar3 != 0)))) goto LAB_00105e14;
              iVar2 = EVP_DigestSignFinal(ctx,buf->base + buf->off,&local_48);
            }
            iVar3 = iVar5;
            if (iVar2 == 1) {
              buf->off = buf->off + local_48;
              iVar3 = 0;
            }
          }
LAB_00105e14:
          EVP_MD_CTX_free(ctx);
          return iVar3;
        }
        sVar8 = sVar8 + 1;
      } while (num_algorithms != sVar8);
    }
    uVar1 = *(uint16_t *)(p_Var4 + 0x10);
    p_Var4 = p_Var4 + 0x10;
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm (driven by server-side preference of `self->schemes`) */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, scheme, outbuf, input);
}